

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

void __thiscall
cmCTestBuildHandler::ProcessBuffer
          (cmCTestBuildHandler *this,char *data,size_t length,size_t *tick,size_t tick_len,
          ostream *ofs,t_BuildProcessingQueueType *queue)

{
  iterator *piVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Map_pointer ppbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer pcVar8;
  _Elt_pointer pbVar9;
  pointer pcVar10;
  pointer pcVar11;
  pointer pcVar12;
  cmCTest *pcVar13;
  bool bVar14;
  size_t sVar15;
  vector<char,std::allocator<char>> *this_00;
  int iVar16;
  _Map_pointer ppbVar17;
  ostream *poVar18;
  long lVar19;
  ulong uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  _Elt_pointer pbVar23;
  ulong uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  char *pcVar26;
  _Elt_pointer pbVar27;
  bool bVar28;
  char *line;
  cmCTestBuildErrorWarning errorwarning;
  undefined1 local_250 [24];
  _Map_pointer local_238;
  ulong *local_230;
  deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_228;
  char *local_220;
  ostream *local_218;
  char *local_210;
  size_t local_208;
  size_t local_200;
  t_ErrorsAndWarningsVector *local_1f8;
  vector<char,std::allocator<char>> *local_1f0;
  undefined1 local_1e8 [112];
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [13];
  iterator local_70;
  iterator local_50;
  
  local_230 = tick;
  local_218 = ofs;
  local_200 = tick_len;
  if (0 < (long)length) {
    pcVar26 = data;
    do {
      pcVar2 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pcVar2 == (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                  ((deque<char,std::allocator<char>> *)queue,pcVar26);
      }
      else {
        *pcVar2 = *pcVar26;
        piVar1 = &(queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      pcVar26 = pcVar26 + 1;
    } while (pcVar26 < data + length);
  }
  this->BuildOutputLogSize = this->BuildOutputLogSize + length;
  local_1f0 = (vector<char,std::allocator<char>> *)&this->CurrentProcessingLine;
  local_228 = (deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->PreContext;
  local_1f8 = &this->ErrorsAndWarnings;
  local_210 = data;
  local_208 = length;
  do {
    this_00 = local_1f0;
    sVar15 = local_200;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_first;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last;
    ppbVar6 = (_Map_pointer)
              (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    pbVar21 = pbVar4;
    pbVar22 = pbVar3;
    pbVar25 = pbVar5;
    ppbVar17 = ppbVar6;
    if (pbVar3 == pbVar7) {
      bVar14 = true;
    }
    else {
      do {
        bVar28 = *(char *)&(pbVar22->_M_dataplus)._M_p == '\n';
        bVar14 = !bVar28;
        if (bVar28) break;
        pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(pbVar22->_M_dataplus)._M_p + 1);
        if (pbVar22 == pbVar25) {
          pbVar21 = ppbVar17[1];
          ppbVar17 = ppbVar17 + 1;
          pbVar25 = pbVar21 + 0x10;
          pbVar22 = pbVar21;
        }
      } while (pbVar22 != pbVar7);
    }
    if (this->MaxWarnings <= this->TotalWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->MaxErrors <= this->TotalErrors) {
      this->ErrorQuotaReached = true;
    }
    if (bVar14) {
      uVar24 = *local_230;
      if (uVar24 * local_200 < this->BuildOutputLogSize) {
        do {
          *local_230 = uVar24 + 1;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          local_250[0] = this->LastTickChar;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,local_250,1);
          pcVar13 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar13,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x453,(char *)local_250._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((_Elt_pointer)local_250._0_8_ != (_Elt_pointer)(local_250 + 0x10)) {
            operator_delete((void *)local_250._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base((ios_base *)&local_178);
          uVar24 = *local_230;
          if ((uVar24 != 0) && (uVar24 == (uVar24 / 0x32) * 0x32)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"  Size: ",8);
            poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"K",1);
            std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
            std::ostream::put((char)poVar18);
            poVar18 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"    ",4);
            pcVar13 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar13,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x45b,(char *)local_250._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((_Elt_pointer)local_250._0_8_ != (_Elt_pointer)(local_250 + 0x10)) {
              operator_delete((void *)local_250._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base((ios_base *)&local_178);
            uVar24 = *local_230;
          }
        } while (uVar24 * sVar15 < this->BuildOutputLogSize);
        this->LastTickChar = '.';
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      sVar15 = local_208;
      pcVar26 = local_210;
      if (local_208 != 0) {
        std::ostream::write(local_1e8,(long)local_210);
        std::ostream::flush();
      }
      pcVar13 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar13,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x464,(char *)local_250._0_8_,false);
      if ((_Elt_pointer)local_250._0_8_ != (_Elt_pointer)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)&local_178);
      if (sVar15 != 0) {
        std::ostream::write((char *)local_218,(long)pcVar26);
        std::ostream::flush();
      }
      return;
    }
    pcVar8 = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar8) {
      (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar8;
    }
    local_250._0_8_ = pbVar22;
    local_250._8_8_ = pbVar21;
    local_250._16_8_ = pbVar25;
    local_238 = ppbVar17;
    local_1e8._0_8_ = pbVar3;
    local_1e8._8_8_ = pbVar4;
    local_1e8._16_8_ = pbVar5;
    local_1e8._24_8_ = ppbVar6;
    std::vector<char,std::allocator<char>>::_M_range_insert<std::_Deque_iterator<char,char&,char*>>
              (local_1f0,pcVar8,local_1e8,local_250);
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>
              ((vector<char,_std::allocator<char>_> *)this_00,local_1e8);
    local_220 = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_start;
    iVar16 = ProcessSingleLine(this,local_220);
    local_1e8._0_8_ =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_cur;
    local_1e8._24_8_ =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_node;
    uVar24 = ((long)pbVar22 - (long)pbVar21) + 1;
    if ((long)pbVar22 - (long)pbVar21 < -1) {
      uVar20 = (long)uVar24 >> 9;
LAB_001c03ce:
      ppbVar17 = ppbVar17 + uVar20;
      local_250._0_8_ = uVar24 + uVar20 * -0x200 + (long)*ppbVar17;
    }
    else {
      if (0x1ff < uVar24) {
        uVar20 = uVar24 >> 9;
        goto LAB_001c03ce;
      }
      local_250._0_8_ = (long)&(pbVar22->_M_dataplus)._M_p + 1;
    }
    local_1e8._8_8_ = *(undefined8 *)local_1e8._24_8_;
    local_1e8._16_8_ = local_1e8._8_8_ + 0x200;
    local_250._8_8_ = *ppbVar17;
    local_250._16_8_ = local_250._8_8_ + 0x200;
    local_238 = ppbVar17;
    std::deque<char,_std::allocator<char>_>::_M_erase
              ((iterator *)&local_70,queue,(iterator *)local_1e8,(iterator *)local_250);
    pcVar26 = local_220;
    local_1e8._8_8_ = local_1e8 + 0x18;
    local_1e8._16_8_ = (_Elt_pointer)0x0;
    local_1e8._24_8_ = local_1e8._24_8_ & 0xffffffffffffff00;
    local_1e8._40_8_ = local_1e8 + 0x38;
    local_1e8._48_8_ = 0;
    local_1e8[0x38] = '\0';
    local_1e8._72_8_ = local_1e8 + 0x58;
    local_1e8._80_8_ = 0;
    local_1e8[0x58] = '\0';
    local_178._M_p = (pointer)&local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_158._M_p = (pointer)local_148;
    local_150 = 0;
    local_148[0]._M_local_buf[0] = '\0';
    if (iVar16 == 2) {
      this->LastTickChar = '!';
      local_1e8[0] = 1;
      this->TotalErrors = this->TotalErrors + 1;
LAB_001c0515:
      local_1e8._4_4_ = (int)this->OutputLineCounter + 1;
      strlen(local_220);
      std::__cxx11::string::_M_replace((ulong)(local_1e8 + 8),0,(char *)0x0,(ulong)pcVar26);
      local_170 = 0;
      *local_178._M_p = '\0';
      local_150 = 0;
      *local_158._M_p = '\0';
      pbVar27 = (this->PreContext).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pbVar9 = (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar27 != pbVar9) {
        pbVar23 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppbVar17 = (this->PreContext).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          local_250._0_8_ = local_250 + 0x10;
          pcVar10 = (pbVar27->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar10,pcVar10 + pbVar27->_M_string_length);
          std::__cxx11::string::append((char *)local_250);
          std::__cxx11::string::_M_append((char *)&local_178,local_250._0_8_);
          if ((_Elt_pointer)local_250._0_8_ != (_Elt_pointer)(local_250 + 0x10)) {
            operator_delete((void *)local_250._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
          }
          pbVar27 = pbVar27 + 1;
          if (pbVar27 == pbVar23) {
            pbVar27 = ppbVar17[1];
            ppbVar17 = ppbVar17 + 1;
            pbVar23 = pbVar27 + 0x10;
          }
        } while (pbVar27 != pbVar9);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>
                (local_1f8,(cmCTestBuildErrorWarning *)local_1e8);
      (this->LastErrorOrWarning)._M_current =
           (this->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      this->PostContextCount = 0;
    }
    else {
      if (iVar16 == 1) {
        this->LastTickChar = '*';
        local_1e8._0_4_ = SUB84(local_1e8._0_8_,1) << 8;
        this->TotalWarnings = this->TotalWarnings + 1;
        goto LAB_001c0515;
      }
      pcVar11 = (this->ErrorsAndWarnings).
                super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((((this->ErrorsAndWarnings).
            super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ._M_impl.super__Vector_impl_data._M_start == pcVar11) ||
          (pcVar12 = (this->LastErrorOrWarning)._M_current, pcVar12 == pcVar11)) ||
         (this->MaxPostContext <= this->PostContextCount)) {
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>(local_228,&local_220);
        ppbVar17 = (this->PreContext).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppbVar6 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pbVar27 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        lVar19 = (long)pbVar27 -
                 (long)(this->PreContext).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5;
        uVar24 = this->MaxPreContext;
        pbVar9 = (this->PreContext).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (uVar24 < ((long)(this->PreContext).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pbVar9 >> 5) +
                     lVar19 + ((((ulong)((long)ppbVar17 - (long)ppbVar6) >> 3) - 1) +
                              (ulong)(ppbVar17 == (_Map_pointer)0x0)) * 0x10) {
          uVar20 = lVar19 - uVar24;
          if ((long)uVar20 < 0) {
            uVar24 = (long)uVar20 >> 4;
LAB_001c0845:
            ppbVar17 = ppbVar17 + uVar24;
            local_70._M_cur = *ppbVar17 + uVar20 + uVar24 * -0x10;
          }
          else {
            if (0xf < uVar20) {
              uVar24 = uVar20 >> 4;
              goto LAB_001c0845;
            }
            local_70._M_cur = pbVar27 + -uVar24;
          }
          local_250._8_8_ = *ppbVar6;
          local_250._16_8_ = local_250._8_8_ + 0x200;
          local_70._M_first = *ppbVar17;
          local_70._M_last = local_70._M_first + 0x10;
          local_250._0_8_ = pbVar9;
          local_238 = ppbVar6;
          local_70._M_node = ppbVar17;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_50,
                     (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_228,(iterator *)local_250,&local_70);
        }
      }
      else {
        this->PostContextCount = this->PostContextCount + 1;
        std::__cxx11::string::append((char *)&pcVar12->PostContext);
        if (this->PostContextCount < this->MaxPostContext) {
          std::__cxx11::string::append
                    ((char *)&((this->LastErrorOrWarning)._M_current)->PostContext);
        }
      }
    }
    this->OutputLineCounter = this->OutputLineCounter + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != local_148) {
      operator_delete(local_158._M_p,
                      CONCAT71(local_148[0]._M_allocated_capacity._1_7_,local_148[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_p != &local_168) {
      operator_delete(local_178._M_p,
                      CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1e8._72_8_ != local_1e8 + 0x58) {
      operator_delete((void *)local_1e8._72_8_,CONCAT71(local_1e8._89_7_,local_1e8[0x58]) + 1);
    }
    if ((undefined1 *)local_1e8._40_8_ != local_1e8 + 0x38) {
      operator_delete((void *)local_1e8._40_8_,CONCAT71(local_1e8._57_7_,local_1e8[0x38]) + 1);
    }
    if ((undefined1 *)local_1e8._8_8_ != local_1e8 + 0x18) {
      operator_delete((void *)local_1e8._8_8_,local_1e8._24_8_ + 1);
    }
  } while( true );
}

Assistant:

void cmCTestBuildHandler::ProcessBuffer(const char* data, size_t length,
                                        size_t& tick, size_t tick_len,
                                        std::ostream& ofs,
                                        t_BuildProcessingQueueType* queue)
{
  const std::string::size_type tick_line_len = 50;
  const char* ptr;
  for (ptr = data; ptr < data + length; ptr++) {
    queue->push_back(*ptr);
  }
  this->BuildOutputLogSize += length;

  // until there are any lines left in the buffer
  while (true) {
    // Find the end of line
    t_BuildProcessingQueueType::iterator it;
    for (it = queue->begin(); it != queue->end(); ++it) {
      if (*it == '\n') {
        break;
      }
    }

    // Once certain number of errors or warnings reached, ignore future errors
    // or warnings.
    if (this->TotalWarnings >= this->MaxWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->TotalErrors >= this->MaxErrors) {
      this->ErrorQuotaReached = true;
    }

    // If the end of line was found
    if (it != queue->end()) {
      // Create a contiguous array for the line
      this->CurrentProcessingLine.clear();
      cm::append(this->CurrentProcessingLine, queue->begin(), it);
      this->CurrentProcessingLine.push_back(0);
      const char* line = this->CurrentProcessingLine.data();

      // Process the line
      int lineType = this->ProcessSingleLine(line);

      // Erase the line from the queue
      queue->erase(queue->begin(), it + 1);

      // Depending on the line type, produce error or warning, or nothing
      cmCTestBuildErrorWarning errorwarning;
      bool found = false;
      switch (lineType) {
        case b_WARNING_LINE:
          this->LastTickChar = '*';
          errorwarning.Error = false;
          found = true;
          this->TotalWarnings++;
          break;
        case b_ERROR_LINE:
          this->LastTickChar = '!';
          errorwarning.Error = true;
          found = true;
          this->TotalErrors++;
          break;
      }
      if (found) {
        // This is an error or warning, so generate report
        errorwarning.LogLine = static_cast<int>(this->OutputLineCounter + 1);
        errorwarning.Text = line;
        errorwarning.PreContext.clear();
        errorwarning.PostContext.clear();

        // Copy pre-context to report
        for (std::string const& pc : this->PreContext) {
          errorwarning.PreContext += pc + "\n";
        }
        this->PreContext.clear();

        // Store report
        this->ErrorsAndWarnings.push_back(std::move(errorwarning));
        this->LastErrorOrWarning = this->ErrorsAndWarnings.end() - 1;
        this->PostContextCount = 0;
      } else {
        // This is not an error or warning.
        // So, figure out if this is a post-context line
        if (!this->ErrorsAndWarnings.empty() &&
            this->LastErrorOrWarning != this->ErrorsAndWarnings.end() &&
            this->PostContextCount < this->MaxPostContext) {
          this->PostContextCount++;
          this->LastErrorOrWarning->PostContext += line;
          if (this->PostContextCount < this->MaxPostContext) {
            this->LastErrorOrWarning->PostContext += "\n";
          }
        } else {
          // Otherwise store pre-context for the next error
          this->PreContext.emplace_back(line);
          if (this->PreContext.size() > this->MaxPreContext) {
            this->PreContext.erase(this->PreContext.begin(),
                                   this->PreContext.end() -
                                     this->MaxPreContext);
          }
        }
      }
      this->OutputLineCounter++;
    } else {
      break;
    }
  }

  // Now that the buffer is processed, display missing ticks
  int tickDisplayed = false;
  while (this->BuildOutputLogSize > (tick * tick_len)) {
    tick++;
    cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                       this->LastTickChar, this->Quiet);
    tickDisplayed = true;
    if (tick % tick_line_len == 0 && tick > 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                         "  Size: "
                           << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                           << std::endl
                           << "    ",
                         this->Quiet);
    }
  }
  if (tickDisplayed) {
    this->LastTickChar = '.';
  }

  // And if this is verbose output, display the content of the chunk
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             cmCTestLogWrite(data, length));

  // Always store the chunk to the file
  ofs << cmCTestLogWrite(data, length);
}